

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  uint uVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiWindow *pIVar7;
  char *pcVar8;
  bool *pbVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  ImS8 IVar13;
  short sVar14;
  ImU32 id;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar18;
  size_t sVar19;
  undefined8 extraout_RAX;
  char *pcVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ImGuiTabItem *pIVar24;
  int iVar25;
  ImGuiCol idx;
  bool is_contents_visible;
  float fVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar27;
  bool text_clipped;
  bool just_closed;
  uint local_bc;
  ImGuiContext *local_b8;
  ImGuiWindow *local_b0;
  ImRect bb;
  bool held;
  float local_74;
  bool hovered;
  undefined7 uStack_6f;
  float fStack_6c;
  undefined1 local_68 [4];
  undefined1 auStack_64 [12];
  ImGuiTextBuffer *local_50;
  char *local_48;
  int local_40;
  int local_3c;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar6 = GImGui;
  local_b0 = GImGui->CurrentWindow;
  if (local_b0->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_b8 = pIVar6;
  local_38 = (bool *)0x0;
  uVar17 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar17 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar17 = flags;
  }
  local_48 = label;
  IVar4 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  local_68 = (undefined1  [4])IVar4.x;
  auStack_64._0_4_ = IVar4.y;
  uVar15 = (tab_bar->Tabs).Size;
  auStack_64._4_4_ = extraout_XMM0_Dc;
  auStack_64._8_4_ = extraout_XMM0_Dd;
  if (0 < (int)uVar15 && id != 0) {
    pIVar18 = (tab_bar->Tabs).Data;
    lVar23 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar18->ID + lVar23) == id) {
        pIVar24 = (ImGuiTabItem *)((long)&pIVar18->ID + lVar23);
        bVar11 = 0;
        goto LAB_00167092;
      }
      lVar23 = lVar23 + 0x24;
    } while ((ulong)uVar15 * 0x24 != lVar23);
  }
  if (uVar15 == (tab_bar->Tabs).Capacity) {
    local_68 = (undefined1  [4])IVar4.x;
    auStack_64._0_4_ = IVar4.y;
    if (uVar15 == 0) {
      iVar21 = 8;
    }
    else {
      iVar21 = (int)uVar15 / 2 + uVar15;
    }
    iVar22 = uVar15 + 1;
    if ((int)(uVar15 + 1) < iVar21) {
      iVar22 = iVar21;
    }
    pIVar18 = (ImGuiTabItem *)MemAlloc((long)iVar22 * 0x24);
    pIVar24 = (tab_bar->Tabs).Data;
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar18,pIVar24,(long)(tab_bar->Tabs).Size * 0x24);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar18;
    (tab_bar->Tabs).Capacity = iVar22;
    uVar15 = (tab_bar->Tabs).Size;
  }
  else {
    pIVar18 = (tab_bar->Tabs).Data;
  }
  pIVar18[(int)uVar15].ID = 0;
  pIVar18[(int)uVar15].Flags = 0;
  pIVar18[(int)uVar15].LastFrameVisible = -1;
  pIVar18[(int)uVar15].LastFrameSelected = -1;
  pIVar18[(int)uVar15].Offset = 0.0;
  pIVar18[(int)uVar15].Width = 0.0;
  pIVar18[(int)uVar15].ContentWidth = 0.0;
  pIVar18 = pIVar18 + (int)uVar15;
  pIVar18->NameOffset = -1;
  pIVar18->BeginOrder = -1;
  pIVar18->IndexDuringLayout = -1;
  pIVar18->WantClose = false;
  pIVar18->field_0x23 = 0;
  iVar21 = (tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = iVar21 + 1;
  pIVar18 = (tab_bar->Tabs).Data;
  pIVar24 = pIVar18 + iVar21;
  pIVar24->ID = id;
  pIVar18[iVar21].Width = (float)local_68;
  tab_bar->TabsAddedNew = true;
  bVar11 = 1;
LAB_00167092:
  pcVar8 = local_48;
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar24 - (int)pIVar18) >> 2) * -0x71c7;
  pIVar24->ContentWidth = (float)local_68;
  sVar14 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar14 + 1;
  pIVar24->BeginOrder = sVar14;
  uVar15 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible + 1;
  iVar21 = local_b8->FrameCount;
  iVar25 = pIVar24->LastFrameVisible + 1;
  pIVar24->LastFrameVisible = iVar21;
  pIVar24->Flags = uVar17;
  local_50 = &tab_bar->TabsNames;
  iVar22 = (tab_bar->TabsNames).Buf.Size;
  sVar14 = (short)iVar22 + -1;
  if (iVar22 == 0) {
    sVar14 = 0;
  }
  pIVar24->NameOffset = sVar14;
  sVar19 = strlen(local_48);
  ImGuiTextBuffer::append(local_50,pcVar8,pcVar8 + sVar19 + 1);
  if (((iVar25 < iVar21) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar16 < iVar21) {
      if ((uVar17 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00167168;
    }
    else if ((uVar17 >> 0x15 & 1) == 0) {
LAB_00167168:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar17 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar17 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar16 < iVar21) && ((tab_bar->Tabs).Size == 1)) {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((bool)((bVar11 | iVar21 <= iVar16) & iVar25 < iVar21)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar17 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar24->LastFrameSelected = local_b8->FrameCount;
  }
  uVar3 = pIVar24->Flags;
  fVar2 = pIVar24->Width;
  fVar26 = pIVar24->Offset;
  local_50 = (ImGuiTextBuffer *)CONCAT71(local_50._1_7_,iVar25 < iVar21);
  if ((uVar3 & 0xc0) == 0) {
    fVar26 = (float)(int)(fVar26 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar26 + (tab_bar->BarRect).Min.x;
  IVar4 = (local_b0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar27.y = bb.Min.y;
  IVar27.x = bb.Min.x;
  (local_b0->DC).CursorPos = IVar27;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_64._0_4_ + bb.Min.y;
  local_bc = uVar17;
  local_40 = iVar25;
  local_3c = iVar21;
  if ((uVar3 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001672e3;
    fStack_6c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_74 = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_68 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001672e3:
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_64;
    _local_68 = auVar5 << 0x20;
  }
  pIVar7 = local_b0;
  pIVar6 = local_b8;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_6c = bb.Max.y - bb.Min.y;
  IVar27 = (local_b0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_b8->Style).FramePadding.y);
  (pIVar7->DC).CursorMaxPos = IVar27;
  bVar10 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar10) {
    if (local_68[0] != '\0') {
      PopClipRect();
    }
    (local_b0->DC).CursorPos = IVar4;
    return is_contents_visible;
  }
  uVar17 = local_bc & 0x200000;
  bVar10 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar17 >> 0x11) + (uint)pIVar6->DragDropActive * 0x200 + 0x1010);
  pbVar9 = local_38;
  if ((bVar10) && (uVar17 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | local_b8->HoveredId == id);
  bVar11 = (byte)local_50;
  if (held == false) {
    bVar12 = local_40 < local_3c;
    SetItemAllowOverlap();
    bVar11 = held ^ 1U | bVar12;
  }
  if (((((bVar11 & 1) == 0) && (bVar12 = IsMouseDragging(0,-1.0), bVar12)) &&
      (local_b8->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
    fVar2 = (local_b8->IO).MouseDelta.x;
    if (fVar2 < 0.0) {
      IVar13 = -1;
      pIVar1 = &(local_b8->IO).MousePos;
      if (bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x) goto LAB_00167425;
LAB_00167440:
      tab_bar->ReorderRequestTabId = pIVar24->ID;
      tab_bar->ReorderRequestDir = IVar13;
    }
    else {
LAB_00167425:
      if (0.0 < fVar2) {
        IVar13 = '\x01';
        if (bb.Max.x < (local_b8->IO).MousePos.x) goto LAB_00167440;
      }
    }
  }
  draw_list = local_b0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((uVar15 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar15 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,local_bc,col);
  RenderNavHighlight((ImGui *)&bb,(ImRect *)(ulong)id,1,col);
  bVar12 = IsItemHovered(8);
  if (bVar12) {
    bVar12 = IsMouseClicked(1,false);
    if (bVar12) {
      uVar17 = local_bc >> 0x15 & 1;
    }
    else {
      bVar12 = IsMouseReleased(1);
      if (!bVar12) goto LAB_0016759b;
    }
    if (uVar17 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0016759b:
  uVar17 = (uint)tab_bar->Flags >> 1 & 4 | local_bc;
  if (pbVar9 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar17,tab_bar->FramePadding,local_48,id,close_button_id,
             is_contents_visible,&just_closed,&text_clipped);
  if ((pbVar9 != (bool *)0x0) && (just_closed != false)) {
    *pbVar9 = false;
    if ((pIVar24->Flags & 1) == 0) {
      pIVar24->WantClose = true;
      if (tab_bar->VisibleTabId == pIVar24->ID) {
        pIVar24->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != pIVar24->ID) {
      tab_bar->NextSelectedTabId = pIVar24->ID;
    }
  }
  if (local_68[0] != '\0') {
    PopClipRect();
  }
  uVar17 = local_bc;
  (local_b0->DC).CursorPos = IVar4;
  if ((((text_clipped == true) && (local_b8->HoveredId == id)) && (held == false)) &&
     (((0.5 < local_b8->HoveredIdNotActiveTimer &&
       (bVar12 = IsItemHovered(0), pcVar8 = local_48, bVar12)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar24->Flags & 0x10) == 0)))))) {
    pcVar20 = FindRenderedTextEnd(local_48,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar20 - (int)pcVar8),pcVar8);
  }
  if ((uVar17 >> 0x15 & 1) == 0) {
    bVar10 = is_contents_visible;
  }
  return bVar10;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}